

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ReporterFactory::findReporterName
          (string *__return_storage_ptr__,ReporterFactory *this,string *osPrefix,
          string *reporterName)

{
  __type _Var1;
  _Base_ptr p_Var2;
  long lVar3;
  pointer __rhs;
  string *psVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1f9;
  string *local_1f8;
  string *local_1f0;
  ReporterFactory *local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
  *local_1e0;
  _Base_ptr local_1d8;
  _Base_ptr local_1d0;
  string trimmedReporterName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidateNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,(string *)reporterName);
  StringUtils::trim((string *)&trimmedReporterName,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string((string *)&local_110,(string *)&trimmedReporterName);
  StringUtils::toLower((string *)&local_d0,&local_110);
  ::std::__cxx11::string::operator=((string *)&trimmedReporterName,(string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_110);
  local_1f8 = &trimmedReporterName;
  ::std::__cxx11::string::string((string *)&local_d0,(string *)&trimmedReporterName);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_d0.second,&trimmedReporterName,"reporter");
  ::std::__cxx11::string::string((string *)&local_130,(string *)osPrefix);
  StringUtils::toLower(&local_f0,&local_130);
  ::std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                   &trimmedReporterName);
  ::std::__cxx11::string::string((string *)&local_170,(string *)osPrefix);
  StringUtils::toLower(&local_150,&local_170);
  ::std::operator+(&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150,
                   &trimmedReporterName);
  ::std::operator+(&local_70,&local_190,"reporter");
  __l._M_len = 4;
  __l._M_array = &local_d0.first;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&candidateNames,__l,&local_1f9);
  lVar3 = 0x60;
  local_1f0 = __return_storage_ptr__;
  do {
    ::std::__cxx11::string::~string((string *)((long)&local_d0.first._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  ::std::__cxx11::string::~string((string *)&local_190);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::__cxx11::string::~string((string *)&local_170);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_130);
  local_1d8 = &(this->map)._M_t._M_impl.super__Rb_tree_header._M_header;
  __rhs = candidateNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = this;
  do {
    if (__rhs == candidateNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      (local_1f0->_M_dataplus)._M_p = (pointer)&local_1f0->field_2;
      local_1f0->_M_string_length = 0;
      (local_1f0->field_2)._M_local_buf[0] = '\0';
      psVar4 = local_1f0;
LAB_0011ac40:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&candidateNames);
      ::std::__cxx11::string::~string((string *)&trimmedReporterName);
      return psVar4;
    }
    p_Var2 = (local_1e8->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var2 != local_1d8) {
      local_1d0 = p_Var2;
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
      ::pair(&local_d0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
              *)(p_Var2 + 1));
      ::std::__cxx11::string::string((string *)&local_190,(string *)&local_d0);
      local_1e0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
                   *)(p_Var2 + 1);
      StringUtils::toLower(&local_f0,(string *)&local_190);
      _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_f0,__rhs);
      ::std::__cxx11::string::~string((string *)&local_f0);
      ::std::__cxx11::string::~string((string *)&local_190);
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>
      ::~pair(&local_d0);
      psVar4 = local_1f0;
      if (_Var1) {
        ::std::__cxx11::string::string((string *)local_1f0,(string *)local_1e0);
        goto LAB_0011ac40;
      }
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(local_1d0);
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

std::string ReporterFactory::findReporterName(const std::string& osPrefix,
                                                  const std::string& reporterName) const
    {
        auto trimmedReporterName = StringUtils::trim(reporterName);
        trimmedReporterName = StringUtils::toLower(trimmedReporterName);

        std::vector<std::string> candidateNames = {
            trimmedReporterName,
            // Allow program names to be specified without Reporter suffix
            trimmedReporterName + "reporter",
            // Allow names without os namespace
            StringUtils::toLower(osPrefix) + trimmedReporterName,
            StringUtils::toLower(osPrefix) + trimmedReporterName + "reporter",
        };

        for (auto& candidateName : candidateNames)
        {
            auto iter = std::find_if(
                map.begin(), map.end(), [&](const Reporters::value_type pair) {
                    return StringUtils::toLower(pair.first) == candidateName;
                });

            if (iter != map.end())
            {
                return iter->first;
            }
        }

        return std::string{};
    }